

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tftp.c
# Opt level: O0

CURLcode tftp_do(Curl_easy *data,_Bool *done)

{
  connectdata *pcVar1;
  tftp_state_data *ptVar2;
  connectdata *conn;
  CURLcode result;
  tftp_state_data *state;
  _Bool *done_local;
  Curl_easy *data_local;
  
  pcVar1 = data->conn;
  *done = false;
  if (((pcVar1->proto).ftpc.pp.cache != (char *)0x0) ||
     (data_local._4_4_ = tftp_connect(data,done), data_local._4_4_ == CURLE_OK)) {
    ptVar2 = (pcVar1->proto).tftpc;
    if (ptVar2 == (tftp_state_data *)0x0) {
      data_local._4_4_ = CURLE_TFTP_ILLEGAL;
    }
    else {
      conn._4_4_ = tftp_perform(data,done);
      if (conn._4_4_ == CURLE_OK) {
        conn._4_4_ = tftp_translate_code(ptVar2->error);
      }
      data_local._4_4_ = conn._4_4_;
    }
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode tftp_do(struct Curl_easy *data, bool *done)
{
  struct tftp_state_data *state;
  CURLcode result;
  struct connectdata *conn = data->conn;

  *done = FALSE;

  if(!conn->proto.tftpc) {
    result = tftp_connect(data, done);
    if(result)
      return result;
  }

  state = conn->proto.tftpc;
  if(!state)
    return CURLE_TFTP_ILLEGAL;

  result = tftp_perform(data, done);

  /* If tftp_perform() returned an error, use that for return code. If it
     was OK, see if tftp_translate_code() has an error. */
  if(!result)
    /* If we have encountered an internal tftp error, translate it. */
    result = tftp_translate_code(state->error);

  return result;
}